

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::generate_go_struct_reader
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *service_name;
  int *piVar2;
  t_field *tfield;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  pointer pptVar5;
  undefined4 extraout_var_00;
  int iVar6;
  pointer pptVar7;
  _Alloc_hider this_00;
  pointer pptVar8;
  string field_method_prefix;
  string field_name_1;
  string thriftFieldTypeId;
  string field_method_prefix_1;
  string local_b0;
  string *local_90;
  pointer local_88;
  pointer local_80;
  string *local_78;
  string local_70;
  string escaped_tstruct_name;
  
  local_90 = tstruct_name;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  (*(this->super_t_generator)._vptr_t_generator[3])
            (&escaped_tstruct_name,this,CONCAT44(extraout_var,iVar3));
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"func (p *",9);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(local_90->_M_dataplus)._M_p,local_90->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->read_method_name_)._M_dataplus._M_p,
                      (this->read_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"(ctx context.Context, iprot thrift.TProtocol) error {",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if _, err := iprot.ReadStructBegin(ctx); err != nil {",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar5) {
    do {
      if ((*pptVar7)->req_ == T_REQUIRED) {
        (*(this->super_t_generator)._vptr_t_generator[3])
                  (&field_method_prefix,this,&(*pptVar7)->name_);
        publicize(&thriftFieldTypeId,this,&field_method_prefix,false,
                  &(this->super_t_generator).service_name_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
          operator_delete(field_method_prefix._M_dataplus._M_p);
        }
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"var isset",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,thriftFieldTypeId._M_dataplus._M_p,
                            thriftFieldTypeId._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," bool = false;",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
          operator_delete(thriftFieldTypeId._M_dataplus._M_p);
        }
        pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 != pptVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"for {",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if err != nil {",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "  return thrift.PrependError(fmt.Sprintf(\"%T field %d read error: \", p, fieldId), err)"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,thriftFieldTypeId._M_dataplus._M_p,thriftFieldTypeId._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if fieldTypeId == thrift.STOP { break; }",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  thriftFieldTypeId._M_dataplus._M_p = (pointer)&thriftFieldTypeId.field_2;
  thriftFieldTypeId._M_string_length = 0;
  thriftFieldTypeId.field_2._M_local_buf[0] = '\0';
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar5) {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"switch fieldId {",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_78 = &(this->super_t_generator).service_name_;
      local_88 = pptVar5;
      local_80 = pptVar7;
      do {
        iVar3 = (*pptVar8)->key_;
        field_method_prefix._M_dataplus._M_p = (pointer)&field_method_prefix.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&field_method_prefix,"ReadField","");
        iVar6 = iVar3;
        if (iVar3 < 0) {
          std::__cxx11::string::append((char *)&field_method_prefix);
          iVar6 = -iVar3;
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"case ",5);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
        this_00 = ::endl_abi_cxx11_._M_dataplus;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        piVar2 = &(this->super_t_generator).indent_;
        *piVar2 = *piVar2 + 1;
        type_to_enum_abi_cxx11_(&field_name_1,(t_go_generator *)this_00._M_p,(*pptVar8)->type_);
        std::__cxx11::string::operator=((string *)&thriftFieldTypeId,(string *)&field_name_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        iVar3 = std::__cxx11::string::compare((char *)&thriftFieldTypeId);
        if (iVar3 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&thriftFieldTypeId,0,(char *)thriftFieldTypeId._M_string_length,0x389117
                    );
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if fieldTypeId == ",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,thriftFieldTypeId._M_dataplus._M_p,
                            thriftFieldTypeId._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," {",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  if err := p.",0xe);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,field_method_prefix._M_dataplus._M_p,
                            field_method_prefix._M_string_length);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(ctx, iprot); err != nil {",0x1a)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    return err",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        if ((*pptVar8)->req_ == T_REQUIRED) {
          (*(this->super_t_generator)._vptr_t_generator[3])
                    (&field_method_prefix_1,this,&(*pptVar8)->name_);
          publicize(&field_name_1,this,&field_method_prefix_1,false,local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)field_method_prefix_1._M_dataplus._M_p != &field_method_prefix_1.field_2) {
            operator_delete(field_method_prefix_1._M_dataplus._M_p);
          }
          t_generator::indent_abi_cxx11_(&field_method_prefix_1,&this->super_t_generator);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,field_method_prefix_1._M_dataplus._M_p,
                              field_method_prefix_1._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  isset",7);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = true",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)field_method_prefix_1._M_dataplus._M_p != &field_method_prefix_1.field_2) {
            operator_delete(field_method_prefix_1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
            operator_delete(field_name_1._M_dataplus._M_p);
          }
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} else {",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"  if err := iprot.Skip(ctx, fieldTypeId); err != nil {",0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    return err",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        piVar2 = &(this->super_t_generator).indent_;
        *piVar2 = *piVar2 + -1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
          operator_delete(field_method_prefix._M_dataplus._M_p);
        }
        pptVar8 = pptVar8 + 1;
      } while (pptVar8 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
      pptVar5 = local_88;
      pptVar7 = local_80;
      if (local_80 == local_88) goto LAB_001fce26;
    }
    t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,field_method_prefix._M_dataplus._M_p,
                        field_method_prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"default:",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
      operator_delete(field_method_prefix._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + 1;
  }
LAB_001fce26:
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := iprot.Skip(ctx, fieldTypeId); err != nil {",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return err",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  if (pptVar7 != pptVar5) {
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,field_method_prefix._M_dataplus._M_p,
                        field_method_prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
      operator_delete(field_method_prefix._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := iprot.ReadFieldEnd(ctx); err != nil {",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return err",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"if err := iprot.ReadStructEnd(ctx); err != nil {",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "  return thrift.PrependError(fmt.Sprintf(\"%T read struct end error: \", p), err)",
             0x4f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar5) {
    paVar1 = &field_name_1.field_2;
    do {
      if ((*pptVar7)->req_ == T_REQUIRED) {
        (*(this->super_t_generator)._vptr_t_generator[3])(&field_name_1,this,&(*pptVar7)->name_);
        publicize(&field_method_prefix,this,&field_name_1,false,
                  &(this->super_t_generator).service_name_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != paVar1) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if !isset",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,field_method_prefix._M_dataplus._M_p,
                            field_method_prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != paVar1) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,
                   "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, fmt.Errorf(\"Required field "
                   ,0x5e);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,field_method_prefix._M_dataplus._M_p,
                            field_method_prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is not set\"));",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != paVar1) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,field_name_1._M_dataplus._M_p,field_name_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name_1._M_dataplus._M_p != paVar1) {
          operator_delete(field_name_1._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
          operator_delete(field_method_prefix._M_dataplus._M_p);
        }
        pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 != pptVar5);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"return nil",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,field_method_prefix._M_dataplus._M_p,field_method_prefix._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
    operator_delete(field_method_prefix._M_dataplus._M_p);
  }
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    service_name = &(this->super_t_generator).service_name_;
    do {
      iVar3 = (*((*pptVar7)->type_->super_t_doc)._vptr_t_doc[3])();
      publicize(&field_method_prefix,this,(string *)CONCAT44(extraout_var_00,iVar3),false,
                service_name);
      publicize(&field_name_1,this,&(*pptVar7)->name_,false,service_name);
      field_method_prefix_1._M_dataplus._M_p = (pointer)&field_method_prefix_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&field_method_prefix_1,"ReadField","");
      iVar3 = (*pptVar7)->key_;
      if (iVar3 < 0) {
        std::__cxx11::string::append((char *)&field_method_prefix_1);
        iVar3 = -iVar3;
      }
      t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"func (p *",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_90->_M_dataplus)._M_p,local_90->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")  ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,field_method_prefix_1._M_dataplus._M_p,
                          field_method_prefix_1._M_string_length);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"(ctx context.Context, iprot thrift.TProtocol) error {",0x35);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + 1;
      tfield = *pptVar7;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"p.","");
      generate_deserialize_field(this,out,tfield,false,&local_70,false,false,false,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      piVar2 = &(this->super_t_generator).indent_;
      *piVar2 = *piVar2 + -1;
      t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  return nil",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_method_prefix_1._M_dataplus._M_p != &field_method_prefix_1.field_2) {
        operator_delete(field_method_prefix_1._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
        operator_delete(field_name_1._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_method_prefix._M_dataplus._M_p != &field_method_prefix.field_2) {
        operator_delete(field_method_prefix._M_dataplus._M_p);
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)thriftFieldTypeId._M_dataplus._M_p != &thriftFieldTypeId.field_2) {
    operator_delete(thriftFieldTypeId._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)escaped_tstruct_name._M_dataplus._M_p != &escaped_tstruct_name.field_2) {
    operator_delete(escaped_tstruct_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::generate_go_struct_reader(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  string escaped_tstruct_name(escape_string(tstruct->get_name()));
  out << indent() << "func (p *" << tstruct_name << ") " << read_method_name_ << "(ctx context.Context, iprot thrift.TProtocol) error {"
      << endl;
  indent_up();
  out << indent() << "if _, err := iprot.ReadStructBegin(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)"
      << endl;
  out << indent() << "}" << endl << endl;

  // Required variables does not have IsSet functions, so we need tmp vars to check them.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      indent(out) << "var isset" << field_name << " bool = false;" << endl;
    }
  }
  out << endl;

  // Loop over reading in fields
  indent(out) << "for {" << endl;
  indent_up();
  // Read beginning field marker
  out << indent() << "_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)" << endl;
  out << indent() << "if err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T field %d read error: \", p, fieldId), err)" << endl;
  out << indent() << "}" << endl;
  // Check for field STOP marker and break
  out << indent() << "if fieldTypeId == thrift.STOP { break; }" << endl;

  string thriftFieldTypeId;
  // Generate deserialization code for known cases
  int32_t field_id = -1;

  // Switch statement on the field we are reading, false if no fields present
  bool have_switch = !fields.empty();
  if (have_switch) {
    indent(out) << "switch fieldId {" << endl;
  }

  // All the fields we know
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_id = (*f_iter)->get_key();

    // if negative id, ensure we generate a valid method name
    string field_method_prefix("ReadField");
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "case " << field_id << ":" << endl;
    indent_up();
    thriftFieldTypeId = type_to_enum((*f_iter)->get_type());

    if (thriftFieldTypeId == "thrift.BINARY") {
      thriftFieldTypeId = "thrift.STRING";
    }

    out << indent() << "if fieldTypeId == " << thriftFieldTypeId << " {" << endl;
    out << indent() << "  if err := p." << field_method_prefix << field_method_suffix << "(ctx, iprot); err != nil {"
        << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;

    // Mark required field as read
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "  isset" << field_name << " = true" << endl;
    }

    out << indent() << "} else {" << endl;
    out << indent() << "  if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;
    out << indent() << "}" << endl;


    indent_down();
  }

  // Begin switch default case
  if (have_switch) {
    out << indent() << "default:" << endl;
    indent_up();
  }

  // Skip unknown fields in either case
  out << indent() << "if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;

  // End switch default case
  if (have_switch) {
    indent_down();
    out << indent() << "}" << endl;
  }

  // Read field end marker
  out << indent() << "if err := iprot.ReadFieldEnd(ctx); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;
  indent_down();
  out << indent() << "}" << endl;
  out << indent() << "if err := iprot.ReadStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T read struct end error: \", p), err)" << endl;
  out << indent() << "}" << endl;

  // Return error if any required fields are missing.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "if !isset" << field_name << "{" << endl;
      out << indent() << "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, "
                         "fmt.Errorf(\"Required field " << field_name << " is not set\"));" << endl;
      out << indent() << "}" << endl;
    }
  }

  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_type_name(publicize((*f_iter)->get_type()->get_name()));
    string field_name(publicize((*f_iter)->get_name()));
    string field_method_prefix("ReadField");
    int32_t field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ")  " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, iprot thrift.TProtocol) error {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, false, "p.");
    indent_down();
    out << indent() << "  return nil" << endl;
    out << indent() << "}" << endl << endl;
  }
}